

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

uint nullcDebugGetSourceLocationLineAndColumn(char *sourceLocation,uint moduleIndex,uint *column)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  
  if (NULLC::linker == 0) {
    uVar2 = 0;
    lVar6 = 0;
    lVar3 = 0;
  }
  else {
    uVar2 = *(uint *)(NULLC::linker + 0x28c);
    lVar6 = *(long *)(NULLC::linker + 0x280);
    lVar3 = *(long *)(NULLC::linker + 0x2a0);
  }
  if (moduleIndex < uVar2) {
    uVar2 = *(uint *)(lVar6 + 0x14 + (ulong)moduleIndex * 0x1c);
  }
  else {
    lVar1 = (ulong)(uVar2 - 1) * 0x1c;
    uVar2 = *(int *)(lVar6 + 0x18 + lVar1) + *(int *)(lVar6 + 0x14 + lVar1);
  }
  pcVar4 = (char *)(lVar3 + (ulong)uVar2);
  uVar2 = 0;
  pcVar5 = pcVar4;
  if (pcVar4 < sourceLocation) {
    uVar2 = 0;
    do {
      if (*pcVar5 == '\n') {
        pcVar4 = pcVar5 + 1;
LAB_0010fbb1:
        uVar2 = uVar2 + 1;
        pcVar5 = pcVar4;
      }
      else {
        if (*pcVar5 == '\r') {
          if (pcVar5[1] == '\n') {
            pcVar4 = pcVar5 + 2;
          }
          else {
            pcVar4 = pcVar5 + 1;
          }
          goto LAB_0010fbb1;
        }
        pcVar5 = pcVar5 + 1;
      }
    } while (pcVar5 < sourceLocation);
  }
  *column = (int)pcVar5 - (int)pcVar4;
  return uVar2;
}

Assistant:

unsigned nullcDebugGetSourceLocationLineAndColumn(const char *sourceLocation, unsigned moduleIndex, unsigned &column)
{
	unsigned moduleCount = 0;
	ExternModuleInfo *modules = nullcDebugModuleInfo(&moduleCount);

	const char* fullSource = nullcDebugSource();

	const char *sourceStart = fullSource + (moduleIndex < moduleCount ? modules[moduleIndex].sourceOffset : modules[moduleCount - 1].sourceOffset + modules[moduleCount - 1].sourceSize);

	unsigned line = 0;

	const char *pos = sourceStart;
	const char *lastLineStart = pos;

	while(pos < sourceLocation)
	{
		if(*pos == '\r')
		{
			line++;

			pos++;

			if(*pos == '\n')
				pos++;

			lastLineStart = pos;
		}
		else if(*pos == '\n')
		{
			line++;

			pos++;

			lastLineStart = pos;
		}
		else
		{
			pos++;
		}
	}

	column = int(pos - lastLineStart);

	return line;
}